

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O2

void __thiscall DOptionMenu::Ticker(DOptionMenu *this)

{
  uint i;
  ulong uVar1;
  
  DMenu::Ticker(&this->super_DMenu);
  uVar1 = 0;
  while( true ) {
    if ((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= uVar1)
    break;
    (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1]->
      super_FListMenuItem)._vptr_FListMenuItem[3])();
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void DOptionMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}